

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O2

bool __thiscall
Rml::FontEffectGlow::Initialise
          (FontEffectGlow *this,int _width_outline,int _width_blur,Vector2i _offset)

{
  ConvolutionFilter *this_00;
  ConvolutionFilter *this_01;
  float *pfVar1;
  ulong uVar2;
  long lVar3;
  Vector2i _kernel_radii;
  int iVar4;
  long lVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_40;
  
  if (-1 < (_width_blur | _width_outline)) {
    this->width_outline = _width_outline;
    this->width_blur = _width_blur;
    this->combined_width = _width_blur + _width_outline;
    this->offset = _offset;
    ConvolutionFilter::Initialise(&this->filter_outline,_width_outline,Dilation);
    uVar2 = (ulong)(uint)this->width_outline;
    for (iVar6 = -this->width_outline; iVar6 <= (int)uVar2; iVar6 = iVar6 + 1) {
      for (lVar5 = (long)-(int)uVar2; iVar4 = (int)lVar5, iVar4 <= (int)uVar2; lVar5 = lVar5 + 1) {
        fVar7 = Math::SquareRoot((float)(iVar4 * iVar4 + iVar6 * iVar6));
        iVar4 = this->width_outline;
        fVar9 = 1.0;
        if (((float)iVar4 < fVar7) && (fVar9 = (float)(iVar4 + 1) - fVar7, fVar9 <= 0.0)) {
          fVar9 = 0.0;
        }
        pfVar1 = ConvolutionFilter::operator[](&this->filter_outline,iVar4 + iVar6);
        uVar2 = (ulong)this->width_outline;
        pfVar1[uVar2 + lVar5] = fVar9;
      }
    }
    fVar7 = 1.0;
    if (this->width_blur != 0) {
      fVar7 = (float)this->width_blur * 0.4;
    }
    fVar7 = (fVar7 + fVar7) * fVar7;
    fVar9 = Math::SquareRoot(fVar7 * 3.1415927);
    this_00 = &this->filter_blur_x;
    _kernel_radii.y = 0;
    _kernel_radii.x = this->width_blur;
    ConvolutionFilter::Initialise(this_00,_kernel_radii,Sum);
    this_01 = &this->filter_blur_y;
    ConvolutionFilter::Initialise(this_01,(Vector2i)((ulong)(uint)this->width_blur << 0x20),Sum);
    iVar6 = this->width_blur;
    local_40 = 0.0;
    for (lVar5 = (long)-iVar6; iVar4 = (int)lVar5, iVar4 <= iVar6; lVar5 = lVar5 + 1) {
      fVar8 = Math::SquareRoot((float)(iVar4 * iVar4) / fVar7);
      fVar8 = Math::Exp(-fVar8);
      fVar8 = fVar8 * (1.0 / fVar9);
      pfVar1 = ConvolutionFilter::operator[](this_00,0);
      iVar6 = this->width_blur;
      pfVar1[iVar6 + lVar5] = fVar8;
      pfVar1 = ConvolutionFilter::operator[](this_01,iVar6 + iVar4);
      *pfVar1 = fVar8;
      local_40 = local_40 + fVar8;
      iVar6 = this->width_blur;
    }
    for (lVar5 = (long)-iVar6; (int)lVar5 <= iVar6; lVar5 = lVar5 + 1) {
      pfVar1 = ConvolutionFilter::operator[](this_00,0);
      iVar6 = this->width_blur;
      lVar3 = iVar6 + lVar5;
      pfVar1[lVar3] = pfVar1[lVar3] / local_40;
      pfVar1 = ConvolutionFilter::operator[](this_01,(int)lVar5 + iVar6);
      *pfVar1 = *pfVar1 / local_40;
      iVar6 = this->width_blur;
    }
  }
  return -1 < (_width_blur | _width_outline);
}

Assistant:

bool FontEffectGlow::Initialise(int _width_outline, int _width_blur, Vector2i _offset)
{
	if (_width_outline < 0 || _width_blur < 0)
		return false;

	width_outline = _width_outline;
	width_blur = _width_blur;
	combined_width = width_blur + width_outline;
	offset = _offset;

	// Outline filter.
	filter_outline.Initialise(width_outline, FilterOperation::Dilation);
	for (int x = -width_outline; x <= width_outline; ++x)
	{
		for (int y = -width_outline; y <= width_outline; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width_outline)
			{
				weight = (width_outline + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter_outline[x + width_outline][y + width_outline] = weight;
		}
	}

	// Gaussian blur filter
	const float std_dev = (width_blur == 0 ? 1.f : .4f * float(width_blur));
	const float two_variance = 2.f * std_dev * std_dev;
	const float gain = 1.f / Math::SquareRoot(Math::RMLUI_PI * two_variance);

	float sum_weight = 0.f;

	// We separate the blur filter into two passes, horizontal and vertical, for performance reasons.
	filter_blur_x.Initialise(Vector2i(width_blur, 0), FilterOperation::Sum);
	filter_blur_y.Initialise(Vector2i(0, width_blur), FilterOperation::Sum);

	for (int x = -width_blur; x <= width_blur; ++x)
	{
		float weight = gain * Math::Exp(-Math::SquareRoot(float(x * x) / two_variance));

		filter_blur_x[0][x + width_blur] = weight;
		filter_blur_y[x + width_blur][0] = weight;
		sum_weight += weight;
	}

	// Normalize the kernels
	for (int x = -width_blur; x <= width_blur; ++x)
	{
		filter_blur_x[0][x + width_blur] /= sum_weight;
		filter_blur_y[x + width_blur][0] /= sum_weight;
	}

	return true;
}